

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostcheck.c
# Opt level: O0

int Curl_cert_hostcheck(char *match_pattern,char *hostname)

{
  int iVar1;
  char *pattern;
  char *hostname_00;
  uint local_2c;
  int res;
  char *hostp;
  char *matchp;
  char *hostname_local;
  char *match_pattern_local;
  
  local_2c = 0;
  if ((((match_pattern != (char *)0x0) && (*match_pattern != '\0')) && (hostname != (char *)0x0)) &&
     ((*hostname != '\0' && (pattern = (*Curl_cstrdup)(match_pattern), pattern != (char *)0x0)))) {
    hostname_00 = (*Curl_cstrdup)(hostname);
    if (hostname_00 != (char *)0x0) {
      iVar1 = hostmatch(hostname_00,pattern);
      local_2c = (uint)(iVar1 == 1);
      (*Curl_cfree)(hostname_00);
    }
    (*Curl_cfree)(pattern);
  }
  return local_2c;
}

Assistant:

int Curl_cert_hostcheck(const char *match_pattern, const char *hostname)
{
  char *matchp;
  char *hostp;
  int res = 0;
  if(!match_pattern || !*match_pattern ||
      !hostname || !*hostname) /* sanity check */
    ;
  else {
    matchp = strdup(match_pattern);
    if(matchp) {
      hostp = strdup(hostname);
      if(hostp) {
        if(hostmatch(hostp, matchp) == CURL_HOST_MATCH)
          res = 1;
        free(hostp);
      }
      free(matchp);
    }
  }

  return res;
}